

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluMinimumBase(word *t,int *pSupp,int nVarsAll,int *pnVars)

{
  word *pwVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  word *pOut;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar;
  uint local_2040;
  word local_2038 [1025];
  
  if (0x10 < nVarsAll) {
    __assert_fail("nVarsAll <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x5ff,"int If_CluMinimumBase(word *, int *, int, int *)");
  }
  uVar8 = 0;
  uVar6 = 0;
  if (0 < nVarsAll) {
    uVar6 = (ulong)(uint)nVarsAll;
  }
  iVar9 = 0;
  uVar3 = 0;
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    iVar2 = If_CluHasVar(t,nVarsAll,(uint)uVar8);
    if (iVar2 != 0) {
      if (pSupp != (int *)0x0) {
        pSupp[iVar9] = pSupp[uVar8];
      }
      uVar3 = uVar3 | 1 << ((uint)uVar8 & 0x1f);
      iVar9 = iVar9 + 1;
    }
  }
  if (pnVars != (int *)0x0) {
    *pnVars = iVar9;
  }
  if ((uVar3 + 1 & uVar3) == 0) {
    iVar9 = 0;
  }
  else {
    pOut = local_2038;
    iVar2 = -1;
    iVar7 = 0;
    bVar5 = false;
    for (uVar4 = 0; local_2040 = (uint)uVar6, uVar4 != local_2040; uVar4 = uVar4 + 1) {
      pwVar1 = pOut;
      iVar = iVar2;
      if ((uVar3 >> (uVar4 & 0x1f) & 1) != 0) {
        for (; pOut = pwVar1, iVar7 < iVar + 1; iVar = iVar + -1) {
          If_CluSwapAdjacent(pOut,t,iVar,nVarsAll);
          bVar5 = (bool)(bVar5 ^ 1);
          pwVar1 = t;
          t = pOut;
        }
        iVar7 = iVar7 + 1;
      }
      iVar2 = iVar2 + 1;
    }
    if (iVar7 != iVar9) {
      __assert_fail("Var == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                    ,0x5f7,"void If_CluTruthShrink(word *, int, int, unsigned int)");
    }
    if (bVar5) {
      If_CluCopy(pOut,t,nVarsAll);
    }
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 16 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_CluHasVar( t, nVarsAll, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_CluSuppIsMinBase( uSupp ) )
        return 0;
    If_CluTruthShrink( t, iVar, nVarsAll, uSupp );
    return 1;
}